

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemerror.cpp
# Opt level: O3

QString * standardLibraryErrorString(QString *__return_storage_ptr__,int errorCode)

{
  char *pcVar1;
  DataPointer *pDVar2;
  QString *in_RCX;
  char *pcVar3;
  QString *pQVar4;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QString local_58;
  QString local_38;
  QString *local_18;
  
  local_18 = *(QString **)(in_FS_OFFSET + 0x28);
  local_38.d.d = (Data *)0x0;
  local_38.d.ptr = (char16_t *)0x0;
  local_38.d.size = 0;
  if (errorCode < 0xd) {
    if (errorCode == 0) goto LAB_0014dae1;
    if (errorCode == 2) {
      pcVar3 = "No such file or directory";
      goto LAB_0014dab2;
    }
LAB_0014db2a:
    pcVar3 = strerror(errorCode);
    if (pcVar3 == (char *)0x0) {
      pQVar4 = (QString *)0x0;
    }
    else {
      pQVar4 = (QString *)0xffffffffffffffff;
      do {
        in_RCX = (QString *)((long)&(pQVar4->d).d + 1);
        pcVar1 = pcVar3 + 1 + (long)pQVar4;
        pQVar4 = in_RCX;
      } while (*pcVar1 != '\0');
    }
    ba_00.m_data = (storage_type *)in_RCX;
    ba_00.m_size = (qsizetype)pcVar3;
    QString::fromLocal8Bit(&local_58,pQVar4,ba_00);
  }
  else {
    if (errorCode == 0xd) {
      pcVar3 = "Permission denied";
    }
    else if (errorCode == 0x1c) {
      pcVar3 = "No space left on device";
    }
    else {
      if (errorCode != 0x18) goto LAB_0014db2a;
      pcVar3 = "Too many open files";
    }
LAB_0014dab2:
    pQVar4 = (QString *)0xffffffffffffffff;
    do {
      pDVar2 = &pQVar4->d;
      pQVar4 = (QString *)((long)&(pQVar4->d).d + 1);
    } while ((pcVar3 + 1)[(long)&pDVar2->d] != '\0');
    ba.m_data = (storage_type *)in_RCX;
    ba.m_size = (qsizetype)pcVar3;
    QString::fromLatin1(&local_58,pQVar4,ba);
  }
  local_38.d.d = local_58.d.d;
  local_38.d.ptr = local_58.d.ptr;
  local_38.d.size = local_58.d.size;
LAB_0014dae1:
  QString::trimmed_helper(__return_storage_ptr__,&local_38);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(QString **)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return *(QString **)(in_FS_OFFSET + 0x28);
}

Assistant:

static QString standardLibraryErrorString(int errorCode)
{
    const char *s = nullptr;
    QString ret;
    switch (errorCode) {
    case 0:
        break;
    case EACCES:
        s = QT_TRANSLATE_NOOP("QIODevice", "Permission denied");
        break;
    case EMFILE:
        s = QT_TRANSLATE_NOOP("QIODevice", "Too many open files");
        break;
    case ENOENT:
        s = QT_TRANSLATE_NOOP("QIODevice", "No such file or directory");
        break;
    case ENOSPC:
        s = QT_TRANSLATE_NOOP("QIODevice", "No space left on device");
        break;
    default: {
      #if QT_CONFIG(thread) && defined(_POSIX_THREAD_SAFE_FUNCTIONS) && _POSIX_VERSION >= 200112L && !defined(Q_OS_INTEGRITY) && !defined(Q_OS_QNX)
            QByteArray buf(1024, Qt::Uninitialized);
            ret = fromstrerror_helper(strerror_r(errorCode, buf.data(), buf.size()), buf);
      #else
            ret = QString::fromLocal8Bit(strerror(errorCode));
      #endif
    break; }
    }
    if (s) {
#ifndef QT_BOOTSTRAPPED
        ret = QCoreApplication::translate("QIODevice", s);
#else
        ret = QString::fromLatin1(s);
#endif
    }
    return ret.trimmed();
}